

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O2

int http_file_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  ulong uVar5;
  char *err_message;
  ulong uVar6;
  int local_a88;
  int contentlength;
  FILE *httpfile;
  char contenttype [100];
  char contentencoding [100];
  char errorstr [1200];
  char recbuf [1200];
  
  if (netoutfile._0_4_ == 0x3a6d656d) {
    iVar1 = http_open(url,0,handle);
    return iVar1;
  }
  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;
  sVar3 = strlen(netoutfile);
  if ((int)sVar3 == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (http_file_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 != 0) {
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    url = "   Timeout may be adjusted with fits_set_timeout";
    goto LAB_001342a0;
  }
  signal(0xe,signal_handler);
  alarm(net_timeout);
  local_a88 = http_open_network(url,&httpfile,contentencoding,contenttype,&contentlength);
  if (local_a88 != 0) {
    alarm(0);
    ffpmsg("Unable to open http file (http_file_open)");
    goto LAB_001342a0;
  }
  closehttpfile = closehttpfile + 1;
  if (netoutfile[0] == '!') {
    uVar5 = 0;
    uVar6 = sVar3 & 0xffffffff;
    if ((int)sVar3 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      netoutfile[uVar5] = netoutfile[uVar5 + 1];
    }
    file_remove(netoutfile);
  }
  __stream = httpfile;
  uVar2 = fgetc((FILE *)httpfile);
  ungetc((int)(char)uVar2,(FILE *)__stream);
  iVar1 = bcmp(contentencoding,"x-gzip",7);
  if ((((((iVar1 == 0) || (iVar1 = bcmp(contentencoding,"x-compress",0xb), iVar1 == 0)) ||
        (iVar1 = bcmp(contenttype,"application/x-gzip",0x13), iVar1 == 0)) ||
       ((iVar1 = bcmp(contenttype,"application/gzip",0x11), iVar1 == 0 ||
        (iVar1 = bcmp(contenttype,"application/gzip-compressed",0x1c), iVar1 == 0)))) ||
      ((iVar1 = bcmp(contenttype,"application/gzipped",0x14), iVar1 == 0 ||
       ((iVar1 = bcmp(contenttype,"application/x-compress",0x17), iVar1 == 0 ||
        (iVar1 = bcmp(contenttype,"application/x-compressed",0x19), (uVar2 & 0xff) == 0x1f)))))) ||
     (iVar1 == 0)) {
    local_a88 = file_create(netoutfile,handle);
    if (local_a88 != 0) goto LAB_0013428d;
    file_close(*handle);
    outfile = (FILE *)fopen(netoutfile,"w");
    if ((FILE *)outfile != (FILE *)0x0) {
      closeoutfile = closeoutfile + 1;
      local_a88 = 0;
      alarm(net_timeout * 10);
      local_a88 = uncompress2file(url,__stream,outfile,&local_a88);
      alarm(0);
      if (local_a88 == 0) {
        fclose((FILE *)outfile);
        piVar4 = &closeoutfile;
LAB_0013439f:
        *piVar4 = *piVar4 + -1;
        fclose((FILE *)__stream);
        closehttpfile = closehttpfile + -1;
        signal(0xe,(__sighandler_t)0x0);
        alarm(0);
        iVar1 = file_open(netoutfile,rwmode,handle);
        return iVar1;
      }
      err_message = "Error uncompressing http file to disk file (http_file_open)";
      goto LAB_00134373;
    }
    url = "Unable to reopen the output file (http_file_open)";
  }
  else {
    local_a88 = file_create(netoutfile,handle);
    if (local_a88 == 0) {
      closefile = closefile + 1;
      if (contentlength % 0xb40 != 0) {
        snprintf(errorstr,0x4b0,"Content-Length not a multiple of 2880 (http_file_open) %d");
        ffpmsg(errorstr);
      }
      alarm(net_timeout);
      do {
        sVar3 = fread(recbuf,1,0x4b0,(FILE *)__stream);
        if (sVar3 == 0) {
          file_close(*handle);
          piVar4 = &closefile;
          goto LAB_0013439f;
        }
        alarm(0);
        local_a88 = file_write(*handle,recbuf,sVar3);
      } while (local_a88 == 0);
      err_message = "Error copying http file to disk file (http_file_open)";
LAB_00134373:
      ffpmsg(err_message);
    }
    else {
LAB_0013428d:
      url = "Unable to create output file (http_file_open)";
    }
  }
  ffpmsg(url);
  url = netoutfile;
LAB_001342a0:
  ffpmsg(url);
  alarm(0);
  if (closehttpfile != 0) {
    fclose((FILE *)httpfile);
  }
  if (closeoutfile != 0) {
    fclose((FILE *)outfile);
  }
  if (closefile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int http_file_open(char *url, int rwmode, int *handle)
{
  FILE *httpfile;
  char contentencoding[SHORTLEN], contenttype[SHORTLEN];
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int contentlength;
  int ii, flen, status;
  char firstchar;

  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( http_open(url, READONLY, handle) );
  }     

  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;

  flen = strlen(netoutfile);
  if (!flen) {
      /* cfileio made a mistake, we need to know where to write the file */
      ffpmsg("Output file not set, shouldn't have happened (http_file_open)");
      return (FILE_NOT_OPENED);
  }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the network connection */
  alarm(net_timeout);
  if ((status = http_open_network(url,&httpfile, contentencoding,
				  contenttype, &contentlength))) {
    alarm(0);
    ffpmsg("Unable to open http file (http_file_open)");
    ffpmsg(url);
    goto error;
  }

  closehttpfile++;

  if (*netoutfile == '!')
  {
     /* user wants to clobber disk file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     status = file_remove(netoutfile);
  }

  firstchar = fgetc(httpfile);
  ungetc(firstchar,httpfile);
  if (!strcmp(contentencoding,"x-gzip") || 
      !strcmp(contentencoding,"x-compress") ||
      !strcmp(contenttype, "application/x-gzip") ||
      !strcmp(contenttype, "application/gzip") ||
      !strcmp(contenttype, "application/gzip-compressed") ||
      !strcmp(contenttype, "application/gzipped") ||
      !strcmp(contenttype, "application/x-compress") ||
      !strcmp(contenttype, "application/x-compressed") ||
      ('\037' == firstchar)) {

    /* to make this more cfitsioish we use the file driver calls to create
       the disk file */

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }

    file_close(*handle);
    if (NULL == (outfile = fopen(netoutfile,"w"))) {
      ffpmsg("Unable to reopen the output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closeoutfile++;
    status = 0;

    /* Ok, this is a tough case, let's be arbritary and say 10*net_timeout,
       Given the choices for nettimeout above they'll probaby ^C before, but
       it's always worth a shot*/

    alarm(net_timeout*10);
    status = uncompress2file(url,httpfile,outfile,&status);
    alarm(0);
    if (status) {
      ffpmsg("Error uncompressing http file to disk file (http_file_open)");
      ffpmsg(url);
      ffpmsg(netoutfile);
      goto error;
    }
    fclose(outfile);
    closeoutfile--;
  } else {
    
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    
    /* Give a warning message.  This could just be bad padding at the end
       so don't treat it like an error. */
    closefile++;
    
    if (contentlength % 2880) {
      snprintf(errorstr, MAXLEN,
	      "Content-Length not a multiple of 2880 (http_file_open) %d",
	      contentlength);
      ffpmsg(errorstr);
    }
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,httpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error copying http file to disk file (http_file_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
    }
    file_close(*handle);
    closefile--;
  }
  
  fclose(httpfile);
  closehttpfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return file_open(netoutfile,rwmode,handle); 

 error:
  alarm(0); /* clear it */
  if (closehttpfile) {
    fclose(httpfile);
  }
  if (closeoutfile) {
    fclose(outfile);
  }
  if (closefile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}